

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O2

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  sunrealtype gu [6];
  ulong local_e0;
  ulong local_d8;
  double adStack_68 [5];
  undefined8 local_40;
  
  lVar9 = N_VGetArrayPointer();
  lVar10 = N_VGetArrayPointer(cB);
  lVar11 = N_VGetArrayPointer(cBdot);
  uVar6 = *(uint *)((long)user_data + 0x40);
  uVar14 = (ulong)uVar6;
  lVar19 = (long)user_data + 0x328;
  uVar7 = *(uint *)((long)user_data + 0x44);
  dVar3 = *(double *)((long)user_data + 0x310);
  dVar4 = *(double *)((long)user_data + 0x318);
  uVar12 = 0;
  uVar20 = 0;
  if (0 < (int)uVar6) {
    uVar20 = (ulong)uVar6;
  }
  for (; uVar20 != uVar12; uVar12 = uVar12 + 1) {
    adStack_68[uVar12] = 0.0;
  }
  lVar22 = (long)user_data + 0x4e28;
  local_40 = 0x3ff0000000000000;
  lVar1 = (long)(int)uVar7 * 8;
  lVar2 = (long)(int)uVar6 * 8;
  lVar32 = 0;
  lVar24 = lVar9;
  lVar34 = lVar10;
  for (lVar17 = 0; lVar17 != 0x14; lVar17 = lVar17 + 1) {
    uVar25 = uVar7;
    if (lVar17 == 0x13) {
      uVar25 = -uVar7;
    }
    uVar15 = -uVar7;
    if (lVar17 == 0) {
      uVar15 = uVar7;
    }
    local_e0 = (ulong)(uVar15 + (int)lVar32);
    local_d8 = (ulong)(uVar25 + (int)lVar32);
    lVar18 = lVar19;
    lVar21 = lVar22;
    lVar23 = lVar24;
    lVar31 = lVar32;
    lVar33 = lVar34;
    for (lVar28 = 0; lVar28 != 0x14; lVar28 = lVar28 + 1) {
      lVar26 = lVar28 * (int)uVar6 + lVar17 * (int)uVar7;
      lVar29 = lVar9 + lVar26 * 8;
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        *(double *)(lVar18 + uVar12 * 8) =
             *(double *)((long)user_data + uVar12 * 8 + 0x250) *
             ((double)(int)lVar28 * dVar3 * (double)(int)lVar17 * dVar4 + 1.0);
      }
      pdVar13 = (double *)((long)user_data + 0x130);
      for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
        pdVar27 = pdVar13;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          *(double *)(lVar18 + uVar16 * 8) =
               *pdVar27 * *(double *)(lVar29 + uVar12 * 8) + *(double *)(lVar18 + uVar16 * 8);
          pdVar27 = pdVar27 + 6;
        }
        pdVar13 = pdVar13 + 1;
      }
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        dVar5 = *(double *)(lVar18 + uVar12 * 8);
        *(double *)(lVar18 + 0x4b00 + uVar12 * 8) = *(double *)(lVar33 + uVar12 * 8) * dVar5;
        *(double *)(lVar18 + uVar12 * 8) = dVar5 * *(double *)(lVar23 + uVar12 * 8);
      }
      pdVar13 = (double *)((long)user_data + 0x130);
      for (uVar12 = 0; uVar12 != uVar20; uVar12 = uVar12 + 1) {
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          *(double *)(lVar21 + uVar16 * 8) =
               pdVar13[uVar16] * *(double *)(lVar29 + uVar12 * 8) *
               *(double *)(lVar10 + lVar26 * 8 + uVar12 * 8) + *(double *)(lVar21 + uVar16 * 8);
        }
        pdVar13 = pdVar13 + 6;
      }
      uVar25 = uVar6;
      if (lVar28 == 0x13) {
        uVar25 = -uVar6;
      }
      uVar15 = -uVar6;
      if (lVar28 == 0) {
        uVar15 = uVar6;
      }
      iVar30 = (int)lVar31;
      for (uVar12 = 0; uVar20 != uVar12; uVar12 = uVar12 + 1) {
        iVar8 = (int)uVar12;
        lVar29 = (long)(iVar8 + iVar30);
        dVar5 = *(double *)(lVar10 + lVar29 * 8);
        *(double *)(lVar11 + lVar29 * 8) =
             ((-*(double *)((long)user_data + uVar12 * 8 + 0x2e0) *
               ((*(double *)(lVar10 + (long)((int)local_d8 + iVar8) * 8) - dVar5) -
               (dVar5 - *(double *)(lVar10 + (long)((int)local_e0 + iVar8) * 8))) -
              ((*(double *)(lVar10 + (long)(int)(uVar25 + iVar30 + iVar8) * 8) - dVar5) -
              (dVar5 - *(double *)(lVar10 + (long)(int)(uVar15 + iVar30 + iVar8) * 8))) *
              *(double *)((long)user_data + uVar12 * 8 + 0x2b0)) -
             *(double *)((long)user_data + lVar29 * 8 + 0x4e28)) - adStack_68[uVar12];
      }
      lVar18 = lVar18 + lVar2;
      lVar23 = lVar23 + lVar2;
      lVar33 = lVar33 + lVar2;
      lVar21 = lVar21 + lVar2;
      lVar31 = lVar31 + uVar14;
      local_e0 = local_e0 + uVar14;
      local_d8 = local_d8 + uVar14;
    }
    lVar19 = lVar19 + lVar1;
    lVar24 = lVar24 + lVar1;
    lVar34 = lVar34 + lVar1;
    lVar22 = lVar22 + lVar1;
    lVar32 = lVar32 + (ulong)uVar7;
  }
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  sunrealtype gu[NS];

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (i = 0; i < ns; i++) { gu[i] = ZERO; }
  gu[ISPEC - 1] = ONE;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici] - gu[i - 1];
      }
    }
  }

  return (0);
}